

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

void __thiscall cmStateDirectory::ComputeRelativePathTopSource(cmStateDirectory *this)

{
  bool bVar1;
  reference this_00;
  string *psVar2;
  PointerType pBVar3;
  cmRange<__gnu_cxx::__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>_>
  cVar4;
  cmStateDirectory local_138;
  undefined1 local_110 [8];
  string currentSource;
  cmStateSnapshot *snp;
  __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
  __end1;
  __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>_>
  local_c8;
  cmRange<__gnu_cxx::__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>_>
  *local_b8;
  cmRange<__gnu_cxx::__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>_>
  *__range1;
  undefined1 local_88 [8];
  string result;
  undefined1 local_40 [8];
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> snapshots;
  cmStateSnapshot snapshot;
  cmStateDirectory *this_local;
  
  snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(this->Snapshot_).State;
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::vector
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40);
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::push_back
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40,
             (value_type *)
             &snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    cmStateSnapshot::GetBuildsystemDirectoryParent
              ((cmStateSnapshot *)((long)&result.field_2 + 8),
               (cmStateSnapshot *)
               &snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)result.field_2._8_8_;
    bVar1 = cmStateSnapshot::IsValid
                      ((cmStateSnapshot *)
                       &snapshots.
                        super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::push_back
              ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40,
               (value_type *)
               &snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  this_00 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::front
                      ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&__range1,this_00);
  psVar2 = GetCurrentSource_abi_cxx11_((cmStateDirectory *)&__range1);
  std::__cxx11::string::string((string *)local_88,(string *)psVar2);
  cVar4 = cmMakeRange<std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                    ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40);
  __begin1 = cVar4.Begin._M_current;
  local_c8 = cmRange<__gnu_cxx::__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>_>
             ::advance((cmRange<__gnu_cxx::__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>_>
                        *)&__begin1,1);
  local_b8 = &local_c8;
  __end1 = cmRange<__gnu_cxx::__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>_>
           ::begin(local_b8);
  snp = (cmStateSnapshot *)
        cmRange<__gnu_cxx::__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>_>
        ::end(local_b8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                                *)&snp);
    if (!bVar1) break;
    currentSource.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
         ::operator*(&__end1);
    cmStateSnapshot::GetDirectory(&local_138,(cmStateSnapshot *)currentSource.field_2._8_8_);
    psVar2 = GetCurrentSource_abi_cxx11_(&local_138);
    std::__cxx11::string::string((string *)local_110,(string *)psVar2);
    bVar1 = cmsys::SystemTools::IsSubDirectory((string *)local_88,(string *)local_110);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_88,(string *)local_110);
    }
    std::__cxx11::string::~string((string *)local_110);
    __gnu_cxx::
    __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
    ::operator++(&__end1);
  }
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  std::__cxx11::string::operator=((string *)&pBVar3->RelativePathTopSource,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~vector
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40);
  return;
}

Assistant:

void cmStateDirectory::ComputeRelativePathTopSource()
{
  // Relative path conversion inside the source tree is not used to
  // construct relative paths passed to build tools so it is safe to use
  // even when the source is a network path.

  cmStateSnapshot snapshot = this->Snapshot_;
  std::vector<cmStateSnapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true) {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid()) {
      snapshots.push_back(snapshot);
    } else {
      break;
    }
  }

  std::string result = snapshots.front().GetDirectory().GetCurrentSource();

  for (cmStateSnapshot const& snp : cmMakeRange(snapshots).advance(1)) {
    std::string currentSource = snp.GetDirectory().GetCurrentSource();
    if (cmSystemTools::IsSubDirectory(result, currentSource)) {
      result = currentSource;
    }
  }
  this->DirectoryState->RelativePathTopSource = result;
}